

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall
BaseIndex::ChainStateFlushed(BaseIndex *this,ChainstateRole role,CBlockLocator *locator)

{
  long lVar1;
  bool bVar2;
  BaseIndex *pBVar3;
  int in_ESI;
  char (*in_RDI) [18];
  long in_FS_OFFSET;
  Level in_stack_00000050;
  CBlockIndex *best_block_index;
  char (*in_stack_00000060) [18];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000070;
  CBlockIndex *locator_tip_index;
  uint256 *locator_tip_hash;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffeac;
  base_blob<256U> *in_stack_fffffffffffffeb0;
  CBlockIndex *in_stack_fffffffffffffeb8;
  uint256 *in_stack_fffffffffffffec0;
  BlockManager *in_stack_fffffffffffffec8;
  CBlockIndex *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffee0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffee8;
  BaseIndex *in_stack_fffffffffffffef8;
  char *fmt;
  LogFlags in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  BaseIndex *this_00;
  ConstevalFormatString<3U> in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  string_view in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI != 2) &&
     (bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffec0), bVar2))
  {
    std::vector<uint256,_std::allocator<uint256>_>::front
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffeb0);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (char *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    pBVar3 = (BaseIndex *)
             ::node::BlockManager::LookupBlockIndex
                       (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    this_00 = pBVar3;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (this_00 == (BaseIndex *)0x0) {
      fmt = "%s: First block (hash=%s) in locator was not found";
      base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffeb0);
      FatalErrorf<char[18],std::__cxx11::string>
                (in_stack_fffffffffffffef8,(ConstevalFormatString<2U>)fmt,in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBVar3);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
    else {
      std::atomic<const_CBlockIndex_*>::load
                ((atomic<const_CBlockIndex_*> *)in_stack_fffffffffffffec0,
                 (memory_order)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      pBVar3 = (BaseIndex *)
               CBlockIndex::GetAncestor
                         (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20))
      ;
      if (pBVar3 == this_00) {
        Commit(this_00);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec8,
                   (char *)in_stack_fffffffffffffec0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec8,
                   (char *)in_stack_fffffffffffffec0);
        base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffeb0);
        CBlockIndex::GetBlockHash(in_stack_fffffffffffffeb8);
        base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffeb0);
        uVar4 = 2;
        LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff60,in_stack_ffffffffffffff1c,
                   in_stack_ffffffffffffff10,in_stack_00000050,in_stack_ffffffffffffff58,
                   in_stack_00000060,in_stack_00000068,in_stack_00000070);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeac,uVar4));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeac,uVar4));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BaseIndex::ChainStateFlushed(ChainstateRole role, const CBlockLocator& locator)
{
    // Ignore events from the assumed-valid chain; we will process its blocks
    // (sequentially) after it is fully verified by the background chainstate.
    if (role == ChainstateRole::ASSUMEDVALID) {
        return;
    }

    if (!m_synced) {
        return;
    }

    const uint256& locator_tip_hash = locator.vHave.front();
    const CBlockIndex* locator_tip_index;
    {
        LOCK(cs_main);
        locator_tip_index = m_chainstate->m_blockman.LookupBlockIndex(locator_tip_hash);
    }

    if (!locator_tip_index) {
        FatalErrorf("%s: First block (hash=%s) in locator was not found",
                   __func__, locator_tip_hash.ToString());
        return;
    }

    // This checks that ChainStateFlushed callbacks are received after BlockConnected. The check may fail
    // immediately after the sync thread catches up and sets m_synced. Consider the case where
    // there is a reorg and the blocks on the stale branch are in the ValidationInterface queue
    // backlog even after the sync thread has caught up to the new chain tip. In this unlikely
    // event, log a warning and let the queue clear.
    const CBlockIndex* best_block_index = m_best_block_index.load();
    if (best_block_index->GetAncestor(locator_tip_index->nHeight) != locator_tip_index) {
        LogPrintf("%s: WARNING: Locator contains block (hash=%s) not on known best "
                  "chain (tip=%s); not writing index locator\n",
                  __func__, locator_tip_hash.ToString(),
                  best_block_index->GetBlockHash().ToString());
        return;
    }

    // No need to handle errors in Commit. If it fails, the error will be already be logged. The
    // best way to recover is to continue, as index cannot be corrupted by a missed commit to disk
    // for an advanced index state.
    Commit();
}